

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.hpp
# Opt level: O2

double __thiscall
openjij::graph::Polynomial<double>::J<int,int>(Polynomial<double> *this,int args,int args_1)

{
  initializer_list<unsigned_long> __l;
  allocator_type local_41;
  double local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> copied_key;
  unsigned_long local_20;
  long local_18;
  
  local_20 = (unsigned_long)args;
  local_18 = (long)args_1;
  __l._M_len = 2;
  __l._M_array = &local_20;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&copied_key,__l,&local_41);
  local_40 = J(this,&copied_key);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&copied_key.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return local_40;
}

Assistant:

FloatType J(Args... args) const {
    std::vector<Index> copied_key{(Index)args...};
    return J(copied_key);
  }